

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_dump_listener.c
# Opt level: O1

HT_ErrorCode ht_file_dump_listener_flush(HT_FileDumpListener *listener,HT_Boolean flush_stream)

{
  int iVar1;
  HT_ErrorCode HVar2;
  
  ht_mutex_lock(listener->mtx);
  HVar2 = HT_ERR_OK;
  if (listener->p_file != (FILE *)0x0) {
    ht_listener_buffer_flush(&listener->buffer,_ht_file_dump_listener_flush,listener);
    if (flush_stream == 1) {
      iVar1 = fflush((FILE *)listener->p_file);
      HVar2 = (HT_ErrorCode)(iVar1 != 0);
    }
  }
  ht_mutex_unlock(listener->mtx);
  return HVar2;
}

Assistant:

HT_ErrorCode
ht_file_dump_listener_flush(HT_FileDumpListener* listener, HT_Boolean flush_stream)
{
    HT_ErrorCode ret = HT_ERR_OK;

    ht_mutex_lock(listener->mtx);

    if (_ht_file_dump_listener_is_stopped(listener))
    {
        ht_mutex_unlock(listener->mtx);
        return ret;
    }

    ht_listener_buffer_flush(&listener->buffer, _ht_file_dump_listener_flush, listener);

    if (flush_stream == HT_TRUE)
    {
        if (fflush(listener->p_file) != 0)
        {
            ret = HT_ERR_UNKNOWN;
        }
    }

    ht_mutex_unlock(listener->mtx);

    return ret;
}